

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O0

int ftellline(FILE *file)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  char local_428 [8];
  char line [1024];
  char *r;
  int i;
  int cur;
  FILE *file_local;
  
  r._0_4_ = 0;
  line[0x3f8] = '\0';
  line[0x3f9] = '\0';
  line[0x3fa] = '\0';
  line[0x3fb] = '\0';
  line[0x3fc] = '\0';
  line[0x3fd] = '\0';
  line[0x3fe] = '\0';
  line[0x3ff] = '\0';
  lVar2 = ftell((FILE *)file);
  iVar1 = (int)lVar2;
  rewind((FILE *)file);
  do {
    do {
      line._1016_8_ = fgets(local_428,0x400,(FILE *)file);
      if ((char *)line._1016_8_ == (char *)0x0) {
        fseek((FILE *)file,(long)iVar1,0);
        return -1;
      }
      sVar3 = strlen((char *)line._1016_8_);
      bVar4 = false;
      if (sVar3 == 0x3ff) {
        bVar4 = *(char *)(line._1016_8_ + 0x3fe) != '\n';
      }
    } while (bVar4);
    file_local._4_4_ = (int)r + 1;
    lVar2 = ftell((FILE *)file);
    r._0_4_ = file_local._4_4_;
  } while (lVar2 <= iVar1);
  iVar1 = fseek((FILE *)file,(long)iVar1,0);
  if (iVar1 != 0) {
    file_local._4_4_ = -1;
  }
  return file_local._4_4_;
}

Assistant:

inline int ftellline(FILE* file)
{ 
	int cur = 0, i = 0;
	char* r = NULL;
	char line[1024];

	cur = ftell(file);
	rewind(file);

	do
	{
		do
		{
			r = fgets(line, sizeof(line), file);
			if (r == NULL) 
			{
				// Go back to initial position.
				fseek(file, cur, SEEK_SET);
				return -1;
			}
		} while ((strlen(r) == sizeof(line)-1)&&(r[sizeof(line)-2] != '\n'));
		i++;
	} while (ftell(file) <= cur);

	// Go back to initial position.
	if (fseek(file, cur, SEEK_SET) != EXIT_SUCCESS) return -1;

	return i;
}